

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

void crnlib::utils::endian_switch_words(uint16 *p,uint num)

{
  uint16 k;
  uint16 *p_end;
  uint16 *puStack_18;
  uint num_local;
  uint16 *p_local;
  
  puStack_18 = p;
  while (puStack_18 != p + num) {
    *puStack_18 = *puStack_18 << 8 | *puStack_18 >> 8;
    puStack_18 = puStack_18 + 1;
  }
  return;
}

Assistant:

void endian_switch_words(uint16* p, uint num)
        {
            uint16* p_end = p + num;
            while (p != p_end)
            {
                uint16 k = *p;
                *p++ = swap16(k);
            }
        }